

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLECDSA.cpp
# Opt level: O0

int __thiscall
OSSLECDSA::sign(OSSLECDSA *this,PrivateKey *privateKey,ByteString *dataToSign,ByteString *signature,
               Type mechanism,void *param_5,size_t param_6)

{
  BIGNUM *pBVar1;
  uint uVar2;
  int iVar3;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  EC_KEY *pEVar4;
  undefined8 extraout_RAX_01;
  undefined8 uVar5;
  undefined4 extraout_var;
  undefined8 extraout_RAX_02;
  uchar *puVar6;
  size_t sVar7;
  ulong uVar8;
  undefined8 extraout_RAX_03;
  undefined8 extraout_RAX_04;
  BIGNUM *bn_s;
  BIGNUM *bn_r;
  ECDSA_SIG *sig;
  size_t len;
  EC_KEY *eckey;
  OSSLECPrivateKey *pk;
  ByteString *in_stack_ffffffffffffff58;
  ByteString *in_stack_ffffffffffffff60;
  ByteString *this_00;
  BIGNUM *local_68;
  BIGNUM *local_60;
  ECDSA_SIG *local_58;
  size_t local_50;
  EC_KEY *local_48;
  OSSLECPrivateKey *local_40;
  void *local_38;
  Type local_2c;
  ByteString *local_28;
  ByteString *local_20;
  OSSLECPrivateKey *local_18;
  OSSLECDSA *local_10;
  undefined1 local_1;
  
  local_38 = param_5;
  local_2c = mechanism;
  local_28 = signature;
  local_20 = dataToSign;
  local_18 = (OSSLECPrivateKey *)privateKey;
  local_10 = this;
  if (mechanism == ECDSA) {
    uVar2 = (*(privateKey->super_Serialisable)._vptr_Serialisable[3])
                      (privateKey,OSSLECPrivateKey::type);
    if ((uVar2 & 1) == 0) {
      softHSMLog(3,"sign",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLECDSA.cpp"
                 ,0x41,"Invalid key type supplied");
      local_1 = 0;
      uVar5 = extraout_RAX_00;
    }
    else {
      local_40 = local_18;
      pEVar4 = OSSLECPrivateKey::getOSSLKey(local_18);
      local_48 = pEVar4;
      if (pEVar4 == (EC_KEY *)0x0) {
        softHSMLog(3,"sign",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLECDSA.cpp"
                   ,0x4b,"Could not get the OpenSSL private key");
        local_1 = 0;
        uVar5 = extraout_RAX_01;
      }
      else {
        uVar5 = EC_KEY_OpenSSL();
        EC_KEY_set_method(pEVar4,uVar5);
        iVar3 = (*(local_40->super_ECPrivateKey).super_PrivateKey.super_Serialisable.
                  _vptr_Serialisable[8])();
        local_50 = CONCAT44(extraout_var,iVar3);
        if (local_50 == 0) {
          softHSMLog(3,"sign",
                     "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLECDSA.cpp"
                     ,100,"Could not get the order length");
          local_1 = 0;
          uVar5 = extraout_RAX_02;
        }
        else {
          ByteString::resize(in_stack_ffffffffffffff60,(size_t)in_stack_ffffffffffffff58);
          puVar6 = ByteString::operator[]
                             (in_stack_ffffffffffffff60,(size_t)in_stack_ffffffffffffff58);
          memset(puVar6,0,local_50 << 1);
          puVar6 = ByteString::const_byte_str(in_stack_ffffffffffffff58);
          sVar7 = ByteString::size((ByteString *)0x12b96c);
          local_58 = ECDSA_do_sign(puVar6,(int)sVar7,(EC_KEY *)local_48);
          if (local_58 == (ECDSA_SIG *)0x0) {
            uVar8 = ERR_get_error();
            softHSMLog(3,"sign",
                       "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLECDSA.cpp"
                       ,0x6c,"ECDSA sign failed (0x%08X)",uVar8);
            local_1 = 0;
            uVar5 = extraout_RAX_03;
          }
          else {
            local_60 = (BIGNUM *)0x0;
            local_68 = (BIGNUM *)0x0;
            ECDSA_SIG_get0(local_58,&local_60,&local_68);
            pBVar1 = local_60;
            sVar7 = local_50;
            this_00 = local_28;
            BN_num_bits(local_60);
            puVar6 = ByteString::operator[](this_00,sVar7);
            BN_bn2bin(pBVar1,puVar6);
            pBVar1 = local_68;
            BN_num_bits(local_68);
            puVar6 = ByteString::operator[](this_00,sVar7);
            BN_bn2bin(pBVar1,puVar6);
            ECDSA_SIG_free(local_58);
            local_1 = 1;
            uVar5 = extraout_RAX_04;
          }
        }
      }
    }
  }
  else {
    softHSMLog(3,"sign",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLECDSA.cpp"
               ,0x3a,"Invalid mechanism supplied (%i)",(ulong)mechanism);
    local_1 = 0;
    uVar5 = extraout_RAX;
  }
  return (int)CONCAT71((int7)((ulong)uVar5 >> 8),local_1);
}

Assistant:

bool OSSLECDSA::sign(PrivateKey* privateKey, const ByteString& dataToSign,
		     ByteString& signature, const AsymMech::Type mechanism,
		     const void* /* param = NULL */, const size_t /* paramLen = 0 */)
{
	if (mechanism != AsymMech::ECDSA)
	{
		ERROR_MSG("Invalid mechanism supplied (%i)", mechanism);
		return false;
	}

	// Check if the private key is the right type
	if (!privateKey->isOfType(OSSLECPrivateKey::type))
	{
		ERROR_MSG("Invalid key type supplied");

		return false;
	}

	OSSLECPrivateKey* pk = (OSSLECPrivateKey*) privateKey;
	EC_KEY* eckey = pk->getOSSLKey();

	if (eckey == NULL)
	{
		ERROR_MSG("Could not get the OpenSSL private key");

		return false;
	}

	// Use the OpenSSL implementation and not any engine
#if OPENSSL_VERSION_NUMBER < 0x10100000L || defined(LIBRESSL_VERSION_NUMBER)

#ifdef WITH_FIPS
	if (FIPS_mode())
		ECDSA_set_method(eckey, FIPS_ecdsa_openssl());
	else
		ECDSA_set_method(eckey, ECDSA_OpenSSL());
#else
	ECDSA_set_method(eckey, ECDSA_OpenSSL());
#endif

#else
	EC_KEY_set_method(eckey, EC_KEY_OpenSSL());
#endif

	// Perform the signature operation
	size_t len = pk->getOrderLength();
	if (len == 0)
	{
		ERROR_MSG("Could not get the order length");
		return false;
	}
	signature.resize(2 * len);
	memset(&signature[0], 0, 2 * len);
	ECDSA_SIG *sig = ECDSA_do_sign(dataToSign.const_byte_str(), dataToSign.size(), eckey);
	if (sig == NULL)
	{
		ERROR_MSG("ECDSA sign failed (0x%08X)", ERR_get_error());
		return false;
	}
	// Store the 2 values with padding
	const BIGNUM* bn_r = NULL;
	const BIGNUM* bn_s = NULL;
	ECDSA_SIG_get0(sig, &bn_r, &bn_s);
	BN_bn2bin(bn_r, &signature[len - BN_num_bytes(bn_r)]);
	BN_bn2bin(bn_s, &signature[2 * len - BN_num_bytes(bn_s)]);
	ECDSA_SIG_free(sig);
	return true;
}